

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O1

void helper_psubsw_mmx_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  
  uVar1 = s->_w_MMXReg[0];
  uVar2 = d->_w_MMXReg[0];
  uVar3 = uVar2 - uVar1;
  if (SBORROW2(uVar2,uVar1)) {
    uVar3 = (-1 < (short)(uVar2 - uVar1)) + 0x7fff;
  }
  uVar1 = d->_w_MMXReg[1];
  d->_w_MMXReg[0] = uVar3;
  uVar2 = s->_w_MMXReg[1];
  uVar3 = uVar1 - uVar2;
  if (SBORROW2(uVar1,uVar2)) {
    uVar3 = (-1 < (short)(uVar1 - uVar2)) + 0x7fff;
  }
  d->_w_MMXReg[1] = uVar3;
  uVar1 = d->_w_MMXReg[2];
  uVar2 = s->_w_MMXReg[2];
  uVar3 = uVar1 - uVar2;
  if (SBORROW2(uVar1,uVar2)) {
    uVar3 = (-1 < (short)(uVar1 - uVar2)) + 0x7fff;
  }
  d->_w_MMXReg[2] = uVar3;
  uVar1 = d->_w_MMXReg[3];
  uVar2 = s->_w_MMXReg[3];
  uVar3 = uVar1 - uVar2;
  if (SBORROW2(uVar1,uVar2)) {
    uVar3 = (-1 < (short)(uVar1 - uVar2)) + 0x7fff;
  }
  d->_w_MMXReg[3] = uVar3;
  return;
}

Assistant:

static inline int satsw(int x)
{
    if (x < -32768) {
        return -32768;
    } else if (x > 32767) {
        return 32767;
    } else {
        return x;
    }
}